

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O1

ByteArray *
ByteArray::fromFile(ByteArray *__return_storage_ptr__,path *fileName,long start,size_t size)

{
  char cVar1;
  uintmax_t uVar2;
  size_t sVar3;
  size_t neededSize;
  ifstream stream;
  undefined1 local_230 [256];
  undefined8 local_130 [33];
  
  ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
            ((basic_ifstream<char,_std::char_traits<char>_> *)local_230,fileName,_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    uVar2 = ghc::filesystem::file_size(fileName);
    sVar3 = uVar2 - start;
    if ((ulong)start <= uVar2 && sVar3 != 0) {
      std::istream::seekg(local_230,start,0);
      neededSize = size;
      if (uVar2 < start + size) {
        neededSize = sVar3;
      }
      if (size == 0) {
        neededSize = sVar3;
      }
      __return_storage_ptr__->data_ = (byte *)0x0;
      __return_storage_ptr__->size_ = 0;
      __return_storage_ptr__->allocatedSize_ = 0;
      grow(__return_storage_ptr__,neededSize);
      std::istream::read(local_230,(long)__return_storage_ptr__->data_);
      __return_storage_ptr__->size_ = local_230._8_8_;
      goto LAB_0014f303;
    }
  }
  __return_storage_ptr__->data_ = (byte *)0x0;
  __return_storage_ptr__->size_ = 0;
  __return_storage_ptr__->allocatedSize_ = 0;
LAB_0014f303:
  local_230._0_8_ =
       std::ifstream-in-ghc::filesystem::basic_ifstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_130[0] = 0x1be630;
  std::filebuf::~filebuf((filebuf *)(local_230 + 0x10));
  local_230._0_8_ =
       std::istream-in-ghc::filesystem::basic_ifstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_130[0] = 0x1be680;
  local_230._8_8_ = 0;
  std::ios_base::~ios_base((ios_base *)local_130);
  return __return_storage_ptr__;
}

Assistant:

ByteArray ByteArray::fromFile(const fs::path& fileName, long start, size_t size)
{
	fs::ifstream stream(fileName, fs::fstream::in | fs::fstream::binary);
	if (!stream.is_open())
		return {};

	auto fileSize = fs::file_size(fileName);
	if (start >= fileSize)
		return {};

	if (size == 0 || start+(long)size > fileSize)
		size = fileSize-start;

	stream.seekg(start);

	ByteArray ret;
	ret.grow(size);

	stream.read(reinterpret_cast<char *>(ret.data()), size);
	ret.size_ = stream.gcount();

	return ret;
}